

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O0

double __thiscall hdc::SymbolTableBuilderVisitor::log(SymbolTableBuilderVisitor *this,double __x)

{
  Logger *this_00;
  string *in_RSI;
  double dVar1;
  allocator local_69;
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  stringstream *msg_local;
  SymbolTableBuilderVisitor *this_local;
  
  local_18 = in_RSI;
  msg_local = (stringstream *)this;
  if (this->logger != (Logger *)0x0) {
    this_00 = this->logger;
    dVar1 = (double)std::__cxx11::stringstream::str();
    Logger::log(this_00,dVar1);
    std::__cxx11::string::~string(local_38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  std::__cxx11::stringstream::str(local_18);
  std::__cxx11::string::~string(local_68);
  dVar1 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return dVar1;
}

Assistant:

void SymbolTableBuilderVisitor::log(std::stringstream& msg) {
    if (logger != nullptr) {
        logger->log(LOG_INTERNAL_SYMBOL_TABLE, msg.str());
    }

    msg.str("");
}